

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O1

void bsp_begin(bsp_pid_t maxprocs)

{
  MPI_Comm comm;
  ulong uVar1;
  unsigned_long max_msg_size_00;
  unsigned_long min_n_hp_msg_size_00;
  bool bVar2;
  int iVar3;
  Spmd *pSVar4;
  Rdma *this;
  Bsmp *this_00;
  size_t small_exch_size_00;
  int small_exch_size;
  double beta;
  double alpha;
  size_t max_msg_size;
  int mpi_pid;
  string method;
  size_t min_n_hp_msg_size;
  int mpi_init;
  int local_94;
  double local_90;
  double local_88;
  unsigned_long local_80;
  int local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  unsigned_long local_50;
  double local_48;
  double local_40;
  int local_34;
  
  local_34 = 0;
  MPI_Initialized(&local_34);
  if (local_34 == 0) {
    MPI_Init(0,0);
    atexit(bsp_check_exit);
  }
  local_74 = 0;
  MPI_Comm_rank(&ompi_mpi_comm_world);
  if (s_spmd != (Spmd *)0x0) {
    bsp_abort("bsp_begin: May be called only once\n");
  }
  if ((maxprocs < 1) && (local_74 == 0)) {
    bsp_abort("bsp_begin: The requested number of processes must be strictly greater than 0. Instead, it was %d\n"
              ,maxprocs);
  }
  pSVar4 = (Spmd *)operator_new(0x28);
  bsplib::Spmd::Spmd(pSVar4,maxprocs);
  s_spmd = pSVar4;
  if (pSVar4->m_active == false) {
    iVar3 = bsplib::Spmd::end_sync(pSVar4);
    if (iVar3 != 0) {
      bsp_abort("bsp_end: Unexpected internal error\n");
    }
    bsplib::Spmd::close(s_spmd,maxprocs);
    pSVar4 = s_spmd;
    if (s_spmd != (Spmd *)0x0) {
      bsplib::Spmd::~Spmd(s_spmd);
      operator_delete(pSVar4,0x28);
    }
    s_spmd = (Spmd *)0x0;
    exit(0);
  }
  local_80 = 0x7fffffff;
  bVar2 = bsplib::read_env<unsigned_long>("BSPONMPI_MAX_MSG_SIZE",&local_80);
  if ((bVar2) || (local_80 == 0)) {
    bsp_begin_cold_1();
  }
  uVar1 = 0x7fffffff / (long)s_spmd->m_nprocs;
  iVar3 = (int)uVar1;
  local_94 = 0x400;
  if (iVar3 < 0x400) {
    local_94 = iVar3;
  }
  bVar2 = bsplib::read_env<int>("BSPONMPI_SMALL_EXCHANGE_SIZE",&local_94);
  if (((bVar2) || (local_94 < 0)) || (iVar3 < local_94)) {
    fprintf(_stderr,
            "bsp_begin: WARNING! BSPONMPI_SMALL_EXCHANGE_SIZE was not an integer between 0 and %d \n"
            ,uVar1 & 0xffffffff);
  }
  local_88 = 10000.0;
  local_90 = 1.0;
  bVar2 = bsplib::read_env<double>("BSPONMPI_P2P_LATENCY",&local_88);
  if ((bVar2) || (local_88 < 0.0)) {
    bsp_begin_cold_2();
  }
  bVar2 = bsplib::read_env<double>("BSPONMPI_P2P_MSGGAP",&local_90);
  if ((bVar2) || (local_90 < 0.0)) {
    bsp_begin_cold_3();
  }
  local_50 = 0;
  bVar2 = bsplib::read_env<unsigned_long>("BSPONMPI_P2P_N_HP",&local_50);
  if (bVar2) {
    bsp_begin_cold_4();
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"rma","");
  bVar2 = bsplib::read_env<std::__cxx11::string>("BSPONMPI_A2A_METHOD",&local_70);
  if (!bVar2) {
    iVar3 = std::__cxx11::string::compare((char *)&local_70);
    if (iVar3 == 0) goto LAB_0010605b;
    iVar3 = std::__cxx11::string::compare((char *)&local_70);
    if (iVar3 == 0) goto LAB_0010605b;
  }
  std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)local_70._M_string_length,0x1104f3);
  bsp_begin_cold_5();
LAB_0010605b:
  this = (Rdma *)operator_new(0x500);
  min_n_hp_msg_size_00 = local_50;
  max_msg_size_00 = local_80;
  comm = s_spmd->m_comm;
  small_exch_size_00 = (size_t)local_94;
  local_40 = local_88;
  local_48 = local_90;
  iVar3 = std::__cxx11::string::compare((char *)&local_70);
  bsplib::Rdma::Rdma(this,comm,max_msg_size_00,small_exch_size_00,local_40,local_48,
                     min_n_hp_msg_size_00,(uint)(iVar3 != 0));
  s_rdma = this;
  this_00 = (Bsmp *)operator_new(0x218);
  bsplib::Bsmp::Bsmp(this_00,s_spmd->m_comm,local_80,(long)local_94);
  s_bsmp = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void bsp_begin( bsp_pid_t maxprocs )
{
    int mpi_init = 0;
    MPI_Initialized(&mpi_init);
    if (!mpi_init) {
        MPI_Init(NULL, NULL);
        atexit( bsp_check_exit );
    }

    int mpi_pid = 0;
    MPI_Comm_rank( MPI_COMM_WORLD, &mpi_pid );

    if (s_spmd)
        bsp_abort( "bsp_begin: May be called only once\n" );
 
    if (mpi_pid == 0 && maxprocs <= 0)
        bsp_abort("bsp_begin: The requested number of processes must be "
                "strictly greater than 0. Instead, it was %d\n", maxprocs );

    s_spmd = new bsplib::Spmd( maxprocs );
    if ( ! s_spmd->active() ) {
        if (s_spmd->end_sync())
            bsp_abort( "bsp_end: Unexpected internal error\n");
        s_spmd->close();
        delete s_spmd;
        s_spmd = NULL;
        std::exit(EXIT_SUCCESS);
    }

    size_t max_msg_size = INT_MAX; 
    if ( bsplib::read_env( "BSPONMPI_MAX_MSG_SIZE", max_msg_size ) 
        || max_msg_size == 0 ) {
        fprintf(stderr, "bsp_begin: WARNING! BSPONMPI_MAX_MSG_SIZE "
                "was not set to a positive, non-zero integer\n");
    }

    int max_small_exchange_size = 
        std::numeric_limits<int>::max() / s_spmd->nprocs() ;
    int small_exch_size = std::min( 1024, max_small_exchange_size ) ;
    if (bsplib::read_env( "BSPONMPI_SMALL_EXCHANGE_SIZE", small_exch_size ) 
        || small_exch_size < 0 
        || small_exch_size > max_small_exchange_size ) {
        fprintf(stderr, "bsp_begin: WARNING! BSPONMPI_SMALL_EXCHANGE_SIZE"
                        " was not an integer between 0 and %d \n",
                        max_small_exchange_size );
    }

    double alpha = 1e+4, beta = 1.0;
    if (bsplib::read_env( "BSPONMPI_P2P_LATENCY", alpha ) || alpha < 0.0) {
        alpha = 1e+4;
        fprintf(stderr, "bsp_begin: BSPONMPI_P2P_LATENCY was not a positive number. Using default: %g\n", alpha);
    }
    if (bsplib::read_env( "BSPONMPI_P2P_MSGGAP", beta ) || beta < 0.0) {
        beta = 1.0;
        fprintf(stderr, "bsp_begin: BSPONMPI_P2P_MSGGAP was not a positive number. Using default: %g\n", beta);
    }
    size_t min_n_hp_msg_size = 0;
    if (bsplib::read_env( "BSPONMPI_P2P_N_HP", min_n_hp_msg_size ) ) {
        min_n_hp_msg_size = 0;
        fprintf(stderr, "bsp_begin: BSPONMPI_P2P_N_HP was not a non-negative integer. Using default %ld\n", (long) min_n_hp_msg_size );
    }

    
    std::string method = "rma";
    if (bsplib::read_env( "BSPONMPI_A2A_METHOD", method ) 
            || ( method != "rma" && method != "msg" ) ) {
        method = "rma";
        fprintf(stderr, "bsp_begin: BSPONMPI_A2A_METHOD was set to "
                "neither 'msg' nor 'rma'. Using default '%s'\n",
                method.c_str() );
    }

    s_rdma = new bsplib::Rdma( s_spmd->comm(), max_msg_size, 
                               small_exch_size, alpha, beta, 
                               min_n_hp_msg_size,
                               method == "rma" ? bsplib::A2A::RMA 
                                               : bsplib::A2A::MSG );
    s_bsmp = new bsplib::Bsmp( s_spmd->comm(), max_msg_size,
                               small_exch_size);
}